

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_insert_text_runes(nk_str *str,int pos,nk_rune *runes,int len)

{
  char local_38 [4];
  int local_34;
  nk_glyph glyph;
  int byte_len;
  int i;
  int len_local;
  nk_rune *runes_local;
  int pos_local;
  nk_str *str_local;
  
  glyph[0] = '\0';
  glyph[1] = '\0';
  glyph[2] = '\0';
  glyph[3] = '\0';
  local_34 = 0;
  if (str != (nk_str *)0x0) {
    if (((str == (nk_str *)0x0) || (runes == (nk_rune *)0x0)) || (len == 0)) {
      str_local._4_4_ = 0;
    }
    else {
      glyph[0] = '\0';
      glyph[1] = '\0';
      glyph[2] = '\0';
      glyph[3] = '\0';
      while ((str_local._4_4_ = len, (int)glyph < len &&
             (local_34 = nk_utf_encode(runes[(int)glyph],local_38,4), local_34 != 0))) {
        nk_str_insert_at_rune(str,pos + (int)glyph,local_38,local_34);
        glyph = (nk_glyph)((int)glyph + 1);
      }
    }
    return str_local._4_4_;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x20d8,"int nk_str_insert_text_runes(struct nk_str *, int, const nk_rune *, int)");
}

Assistant:

NK_API int
nk_str_insert_text_runes(struct nk_str *str, int pos, const nk_rune *runes, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_glyph glyph;

    NK_ASSERT(str);
    if (!str || !runes || !len) return 0;
    for (i = 0; i < len; ++i) {
        byte_len = nk_utf_encode(runes[i], glyph, NK_UTF_SIZE);
        if (!byte_len) break;
        nk_str_insert_at_rune(str, pos+i, glyph, byte_len);
    }
    return len;
}